

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *this,AbstractProgram *x)

{
  AbstractProgram *pAVar1;
  
  pAVar1 = (AbstractProgram *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pAVar1 != x) &&
     (this->ptr_ = (uintp)pAVar1, pAVar1 != (AbstractProgram *)0x0)) {
    (*pAVar1->_vptr_AbstractProgram[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}